

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4.h
# Opt level: O0

vector3d<float> __thiscall
irr::core::CMatrix4<float>::getRotationDegrees(CMatrix4<float> *this,vector3d<float> *scale_)

{
  float fVar1;
  vector3d<float> vVar2;
  bool bVar3;
  float *pfVar4;
  f32 *in_RSI;
  CMatrix4<float> *in_RDI;
  f64 fVar5;
  double *value;
  f64 nz;
  double dVar6;
  double f;
  f64 invC;
  f64 Z;
  f64 X;
  f64 roty;
  f64 rotx;
  f64 C;
  f64 Y;
  vector3d<double> invScale;
  vector3d<double> scale;
  CMatrix4<float> *mat;
  double *in_stack_ffffffffffffff08;
  float local_dc;
  float local_cc;
  float local_bc;
  double local_a0;
  double local_98;
  double local_60;
  vector3d<double> local_58;
  vector3d<double> local_40;
  CMatrix4<float> *local_28;
  f32 *local_20;
  vector3d<float> local_c;
  
  local_28 = in_RDI;
  local_20 = in_RSI;
  bVar3 = iszero(*in_RSI,1e-06);
  if (bVar3) {
    local_bc = 3.4028235e+38;
  }
  else {
    local_bc = (float)*local_20;
  }
  bVar3 = iszero(local_20[1],1e-06);
  if (bVar3) {
    local_cc = 3.4028235e+38;
  }
  else {
    local_cc = (float)local_20[1];
  }
  bVar3 = iszero(local_20[2],1e-06);
  if (bVar3) {
    local_dc = 3.4028235e+38;
  }
  else {
    local_dc = (float)local_20[2];
  }
  vector3d<double>::vector3d(&local_40,(double)local_bc,(double)local_cc,(double)local_dc);
  fVar5 = reciprocal((f64)local_40.X);
  value = (double *)reciprocal((f64)local_40.Y);
  nz = reciprocal((f64)local_40.Z);
  vector3d<double>::vector3d(&local_58,(double)fVar5,(double)value,(double)nz);
  operator[](local_28,2);
  dVar6 = clamp<double>(value,in_stack_ffffffffffffff08,(double *)0x2bf8ce);
  dVar6 = asin(dVar6);
  f = cos(-dVar6);
  local_60 = -dVar6 * 57.29577951308232;
  bVar3 = iszero((f32)(float)f,1e-06);
  if (bVar3) {
    local_98 = 0.0;
    pfVar4 = operator[](local_28,5);
    dVar6 = (double)*pfVar4 * local_58.Y;
    pfVar4 = operator[](local_28,4);
    local_a0 = atan2((double)-*pfVar4 * local_58.Y,dVar6);
  }
  else {
    fVar5 = reciprocal((f64)f);
    pfVar4 = operator[](local_28,10);
    fVar1 = *pfVar4;
    pfVar4 = operator[](local_28,6);
    local_98 = atan2((double)*pfVar4 * (double)fVar5 * local_58.Y,
                     (double)fVar1 * (double)fVar5 * local_58.Z);
    local_98 = local_98 * 57.29577951308232;
    pfVar4 = operator[](local_28,0);
    dVar6 = (double)*pfVar4 * (double)fVar5 * local_58.X;
    pfVar4 = operator[](local_28,1);
    local_a0 = atan2((double)*pfVar4 * (double)fVar5 * local_58.X,dVar6);
  }
  local_a0 = local_a0 * 57.29577951308232;
  if (local_98 < 0.0) {
    local_98 = local_98 + 360.0;
  }
  if (local_60 < 0.0) {
    local_60 = local_60 + 360.0;
  }
  if (local_a0 < 0.0) {
    local_a0 = local_a0 + 360.0;
  }
  vector3d<float>::vector3d(&local_c,(float)local_98,(float)local_60,(float)local_a0);
  vVar2.Z = local_c.Z;
  vVar2.X = local_c.X;
  vVar2.Y = local_c.Y;
  return vVar2;
}

Assistant:

inline core::vector3d<T> CMatrix4<T>::getRotationDegrees(const vector3d<T> &scale_) const
{
	const CMatrix4<T> &mat = *this;
	const core::vector3d<f64> scale(core::iszero(scale_.X) ? FLT_MAX : scale_.X, core::iszero(scale_.Y) ? FLT_MAX : scale_.Y, core::iszero(scale_.Z) ? FLT_MAX : scale_.Z);
	const core::vector3d<f64> invScale(core::reciprocal(scale.X), core::reciprocal(scale.Y), core::reciprocal(scale.Z));

	f64 Y = -asin(core::clamp(mat[2] * invScale.X, -1.0, 1.0));
	const f64 C = cos(Y);
	Y *= RADTODEG64;

	f64 rotx, roty, X, Z;

	if (!core::iszero((T)C)) {
		const f64 invC = core::reciprocal(C);
		rotx = mat[10] * invC * invScale.Z;
		roty = mat[6] * invC * invScale.Y;
		X = atan2(roty, rotx) * RADTODEG64;
		rotx = mat[0] * invC * invScale.X;
		roty = mat[1] * invC * invScale.X;
		Z = atan2(roty, rotx) * RADTODEG64;
	} else {
		X = 0.0;
		rotx = mat[5] * invScale.Y;
		roty = -mat[4] * invScale.Y;
		Z = atan2(roty, rotx) * RADTODEG64;
	}

	// fix values that get below zero
	if (X < 0.0)
		X += 360.0;
	if (Y < 0.0)
		Y += 360.0;
	if (Z < 0.0)
		Z += 360.0;

	return vector3d<T>((T)X, (T)Y, (T)Z);
}